

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O0

void __thiscall
sc_core::sc_vector_base::context_scope::context_scope(context_scope *this,sc_vector_base *owner)

{
  sc_simcontext *psVar1;
  sc_simcontext *psVar2;
  sc_object *psVar3;
  sc_object *psVar4;
  sc_object_manager *this_00;
  sc_object *in_RSI;
  undefined8 *in_RDI;
  sc_object *active;
  sc_object *parent;
  sc_simcontext *simc;
  sc_object *in_stack_ffffffffffffffb8;
  sc_simcontext *in_stack_ffffffffffffffc0;
  
  *in_RDI = 0;
  psVar1 = sc_object::simcontext(in_RSI);
  psVar2 = sc_get_curr_simcontext();
  if (psVar1 == psVar2) {
    psVar3 = sc_object::get_parent_object(in_RSI);
    psVar4 = sc_simcontext::active_object(in_stack_ffffffffffffffc0);
    if (psVar3 != psVar4) {
      *in_RDI = in_RSI;
      psVar1 = sc_object::simcontext(in_RSI);
      this_00 = sc_simcontext::get_object_manager(psVar1);
      sc_object::get_parent_object((sc_object *)*in_RDI);
      sc_object_manager::hierarchy_push(this_00,in_stack_ffffffffffffffb8);
    }
    return;
  }
  sc_assertion_failed((char *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,0);
}

Assistant:

sc_vector_base::context_scope::context_scope( sc_vector_base* owner )
  : owner_(NULL)
{
  sc_simcontext* simc = owner->simcontext();
  sc_assert( simc == sc_get_curr_simcontext() );

  sc_object* parent = owner->get_parent_object();
  sc_object* active = simc->active_object();

  if (parent != active) // override object creation context
  {
    owner_ = owner;
    owner->simcontext()->get_object_manager()
      ->hierarchy_push( owner_->get_parent_object() );
  }
}